

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O0

ssize_t mem_read(hFILE *fpv,void *buffer,size_t nbytes)

{
  size_t avail;
  hFILE_mem *fp;
  size_t nbytes_local;
  void *buffer_local;
  hFILE *fpv_local;
  
  fp = (hFILE_mem *)nbytes;
  if ((hFILE_mem *)(fpv[1].begin + -(long)fpv[1].end) < nbytes) {
    fp = (hFILE_mem *)(fpv[1].begin + -(long)fpv[1].end);
  }
  memcpy(buffer,fpv[1].end + (long)fpv[1].buffer,(size_t)fp);
  fpv[1].end = fpv[1].end + (long)&fp->base;
  return (ssize_t)fp;
}

Assistant:

static ssize_t mem_read(hFILE *fpv, void *buffer, size_t nbytes)
{
    hFILE_mem *fp = (hFILE_mem *) fpv;
    size_t avail = fp->length - fp->pos;
    if (nbytes > avail) nbytes = avail;
    memcpy(buffer, fp->buffer + fp->pos, nbytes);
    fp->pos += nbytes;
    return nbytes;
}